

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

BOOL __thiscall
Js::InterpreterStackFrame::OP_BrOnHasEnvProperty
          (InterpreterStackFrame *this,Var envInstance,int32 slotIndex,uint propertyIdIndex,
          ScriptContext *scriptContext)

{
  PropertyId propertyId;
  BOOL BVar1;
  Var instance;
  
  instance = OP_LdFrameDisplaySlot(this,envInstance,slotIndex);
  propertyId = FunctionBody::GetReferencedPropertyId
                         (*(FunctionBody **)(this + 0x88),propertyIdIndex);
  BVar1 = JavascriptOperators::OP_HasProperty(instance,propertyId,scriptContext);
  return BVar1;
}

Assistant:

BOOL InterpreterStackFrame::OP_BrOnHasEnvProperty(Var envInstance, int32 slotIndex, uint propertyIdIndex, ScriptContext* scriptContext)
    {
        Var instance = OP_LdFrameDisplaySlot(envInstance, slotIndex);
        return JavascriptOperators::OP_HasProperty(instance,
            this->m_functionBody->GetReferencedPropertyId(propertyIdIndex), scriptContext);
    }